

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::IsHDEnabled(CWallet *this)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte bVar3;
  _Base_ptr p_Var4;
  byte bVar5;
  long in_FS_OFFSET;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  _Stack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&_Stack_58,this);
  p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)_Stack_58._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar3 = 1;
    bVar5 = 0;
  }
  else {
    p_Var4 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = 0;
    do {
      bVar5 = bVar2;
      bVar3 = (**(code **)(**(long **)(p_Var4 + 1) + 0x60))();
      if (bVar3 == 0) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      bVar5 = 1;
      bVar2 = 1;
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&_Stack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & bVar5);
}

Assistant:

bool CWallet::IsHDEnabled() const
{
    // All Active ScriptPubKeyMans must be HD for this to be true
    bool result = false;
    for (const auto& spk_man : GetActiveScriptPubKeyMans()) {
        if (!spk_man->IsHDEnabled()) return false;
        result = true;
    }
    return result;
}